

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionSystemBullet.cpp
# Opt level: O2

void __thiscall
chrono::collision::ChCollisionSystemBullet::ReportContacts
          (ChCollisionSystemBullet *this,ChContactContainer *mcontactcontainer)

{
  uint uVar1;
  cbtCollisionObject *pcVar2;
  cbtCollisionObject *pcVar3;
  element_type *peVar4;
  element_type *peVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  char cVar8;
  uint uVar9;
  int iVar10;
  undefined4 extraout_var;
  ulong uVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  float fVar15;
  undefined8 extraout_XMM0_Qa;
  double dVar16;
  undefined8 extraout_XMM0_Qa_00;
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined8 in_XMM6_Qb;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  ulong local_120;
  cbtCollisionObject *local_118;
  cbtCollisionObject *local_110;
  undefined1 local_108 [64];
  double dStack_c8;
  double dStack_c0;
  ChVector<double> CStack_b8;
  double local_a0;
  float *local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  double dStack_68;
  double dStack_60;
  undefined1 local_58 [32];
  cbtPersistentManifold *this_00;
  
  (*(mcontactcontainer->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x3e])(mcontactcontainer);
  ChCollisionInfo::ChCollisionInfo((ChCollisionInfo *)local_108);
  uVar9 = (*this->bt_collision_world->m_dispatcher1->_vptr_cbtDispatcher[9])();
  uVar11 = 0;
  do {
    if ((uint)uVar11 == (~((int)uVar9 >> 0x1f) & uVar9)) {
      (*(mcontactcontainer->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x41])();
      return;
    }
    auVar13 = in_ZMM0._0_16_;
    local_120 = uVar11;
    iVar10 = (*this->bt_collision_world->m_dispatcher1->_vptr_cbtDispatcher[10])();
    this_00 = (cbtPersistentManifold *)CONCAT44(extraout_var,iVar10);
    pcVar2 = this_00->m_body0;
    pcVar3 = this_00->m_body1;
    cbtPersistentManifold::refreshContactPoints
              (this_00,&pcVar2->m_worldTransform,&pcVar3->m_worldTransform);
    local_108._0_8_ = pcVar2->m_userObjectPointer;
    local_108._8_8_ = pcVar3->m_userObjectPointer;
    local_118 = pcVar3;
    local_110 = pcVar2;
    (*((ChCollisionModel *)local_108._0_8_)->_vptr_ChCollisionModel[0x25])();
    local_138 = auVar13;
    (*(*(_func_int ***)local_108._8_8_)[0x25])();
    local_58._0_16_ = auVar13;
    (*(*(_func_int ***)local_108._0_8_)[0x23])();
    fVar15 = auVar13._0_4_;
    local_148._0_4_ = fVar15;
    (*(*(_func_int ***)local_108._8_8_)[0x23])();
    peVar4 = (this->super_ChCollisionSystem).broad_callback.
             super___shared_ptr<chrono::collision::ChCollisionSystem::BroadphaseCallback,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (peVar4 == (element_type *)0x0) {
LAB_00d44b93:
      uVar1 = this_00->m_cachedPoints;
      lVar12 = 0;
      auVar13 = vinsertps_avx(local_138,ZEXT416((uint)local_58._0_4_),0x10);
      auVar13 = vcvtps2pd_avx(auVar13);
      local_58 = ZEXT1632(auVar13);
      _local_78 = vpermpd_avx2(local_58,0x40);
      auVar6 = vshufpd_avx(auVar13,auVar13,1);
      in_ZMM0 = ZEXT864((ulong)((double)(float)local_148._0_4_ + (double)fVar15));
      local_88 = vshufpd_avx(auVar13,auVar13,3);
      local_138._0_8_ = (double)(float)local_148._0_4_ + (double)fVar15;
      local_148 = auVar6;
      for (; (ulong)(~((int)uVar1 >> 0x1f) & uVar1) * 0xe0 - lVar12 != 0; lVar12 = lVar12 + 0xe0) {
        dVar16 = (double)*(float *)((long)(&this_00->m_pointCache[0].m_normalWorldOnB + 1) + lVar12)
        ;
        in_ZMM0 = ZEXT1664(CONCAT88(in_XMM6_Qb,dVar16));
        if (dVar16 < (double)local_138._0_8_) {
          auVar13._8_8_ = 0;
          auVar13._0_8_ =
               *(ulong *)((long)this_00->m_pointCache[0].m_positionWorldOnA.m_floats + lVar12 + 4);
          auVar13 = vpermt2ps_avx512vl(auVar13,_DAT_00f48910,
                                       ZEXT416(*(uint *)((long)this_00->m_pointCache[0].
                                                               m_positionWorldOnA.m_floats + lVar12)
                                              ));
          auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)((long)this_00->m_pointCache[0].
                                                                  m_positionWorldOnB.m_floats +
                                                           lVar12)),0x30);
          CStack_b8.m_data[2] =
               (double)-*(float *)((long)this_00->m_pointCache[0].m_normalWorldOnB.m_floats +
                                  lVar12 + 8);
          auVar17._24_4_ = 0x80000000;
          auVar17._16_8_ =
               *(ulong *)((long)this_00->m_pointCache[0].m_normalWorldOnB.m_floats + lVar12) ^
               0x8000000080000000;
          auVar17._28_4_ = 0x80000000;
          auVar20._16_8_ =
               *(undefined8 *)
                ((long)this_00->m_pointCache[0].m_positionWorldOnB.m_floats + lVar12 + 4);
          auVar20._0_16_ = auVar13;
          auVar20._24_8_ = 0;
          auVar17._0_16_ = auVar13;
          auVar17 = vshufpd_avx(auVar20,auVar17,2);
          auVar14 = vcvtps2pd_avx512f(auVar17);
          local_108._32_32_ = auVar14._0_32_;
          dStack_c8 = auVar14._32_8_;
          dStack_c0 = auVar14._40_8_;
          CStack_b8.m_data[0] = auVar14._48_8_;
          CStack_b8.m_data[1] = auVar14._56_8_;
          ChVector<double>::Normalize(&CStack_b8);
          auVar7._8_8_ = CStack_b8.m_data[2];
          auVar7._0_8_ = CStack_b8.m_data[1];
          auVar6._8_8_ = CStack_b8.m_data[1];
          auVar6._0_8_ = CStack_b8.m_data[0];
          dStack_c8 = CStack_b8.m_data[1] * (double)local_88._0_8_ + dStack_c8;
          dStack_c0 = CStack_b8.m_data[2] * (double)local_88._8_8_ + dStack_c0;
          local_a0 = (double)*(float *)((long)(&this_00->m_pointCache[0].m_normalWorldOnB + 1) +
                                       lVar12) + (double)local_58._0_8_ + (double)local_148._0_8_;
          auVar13 = vshufpd_avx(auVar7,auVar6,1);
          auVar6 = vunpcklpd_avx(auVar6,auVar7);
          auVar18._0_8_ = auVar6._0_8_ * (double)local_78._0_8_;
          auVar18._8_8_ = auVar6._8_8_ * (double)local_78._8_8_;
          auVar18._16_8_ = auVar13._0_8_ * dStack_68;
          auVar18._24_8_ = auVar13._8_8_ * dStack_60;
          auVar17 = vsubpd_avx(local_108._32_32_,auVar18);
          auVar19._0_8_ = local_108._32_8_ + auVar18._0_8_;
          auVar19._8_8_ = local_108._40_8_ + auVar18._8_8_;
          auVar19._16_8_ = local_108._48_8_ + auVar18._16_8_;
          auVar19._24_8_ = local_108._56_8_ + auVar18._24_8_;
          local_108._32_32_ = vblendpd_avx(auVar17,auVar19,8);
          in_ZMM0 = ZEXT864((ulong)local_a0);
          local_90 = (float *)((long)this_00->m_pointCache[0].reactions_cache + lVar12);
          ChCollisionModel::GetShape((ChCollisionModel *)local_158,(int)local_108._0_8_);
          local_108._16_8_ = local_158._0_8_;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_158 + 8));
          ChCollisionModel::GetShape((ChCollisionModel *)local_158,(int)local_108._8_8_);
          local_108._24_8_ = local_158._0_8_;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_158 + 8));
          peVar5 = (this->super_ChCollisionSystem).narrow_callback.
                   super___shared_ptr<chrono::collision::ChCollisionSystem::NarrowphaseCallback,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          if (peVar5 != (element_type *)0x0) {
            cVar8 = (**(code **)(*(long *)peVar5 + 0x10))(peVar5,local_108);
            in_ZMM0._8_56_ = extraout_var_01;
            in_ZMM0._0_8_ = extraout_XMM0_Qa_00;
            if (cVar8 == '\0') goto LAB_00d44e05;
          }
          (*(mcontactcontainer->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x40])
                    (mcontactcontainer,local_108);
        }
LAB_00d44e05:
      }
    }
    else {
      local_78._0_4_ = fVar15;
      cVar8 = (**(code **)(*(long *)peVar4 + 0x10))(peVar4,local_108._0_8_,local_108._8_8_);
      in_ZMM0._8_56_ = extraout_var_00;
      in_ZMM0._0_8_ = extraout_XMM0_Qa;
      fVar15 = (float)local_78._0_4_;
      if (cVar8 != '\0') goto LAB_00d44b93;
    }
    uVar11 = (ulong)((int)local_120 + 1);
  } while( true );
}

Assistant:

void ChCollisionSystemBullet::ReportContacts(ChContactContainer* mcontactcontainer) {
    // This should remove all old contacts (or at least rewind the index)
    mcontactcontainer->BeginAddContact();

    // NOTE: Bullet does not provide information on radius of curvature at a contact point.
    // As such, for all Bullet-identified contacts, the default value will be used (SMC only).
    ChCollisionInfo icontact;

    int numManifolds = bt_collision_world->getDispatcher()->getNumManifolds();
    for (int i = 0; i < numManifolds; i++) {
        cbtPersistentManifold* contactManifold = bt_collision_world->getDispatcher()->getManifoldByIndexInternal(i);
        const cbtCollisionObject* obA = contactManifold->getBody0();
        const cbtCollisionObject* obB = contactManifold->getBody1();
        contactManifold->refreshContactPoints(obA->getWorldTransform(), obB->getWorldTransform());

        icontact.modelA = (ChCollisionModel*)obA->getUserPointer();
        icontact.modelB = (ChCollisionModel*)obB->getUserPointer();

        double envelopeA = icontact.modelA->GetEnvelope();
        double envelopeB = icontact.modelB->GetEnvelope();

        double marginA = icontact.modelA->GetSafeMargin();
        double marginB = icontact.modelB->GetSafeMargin();

        // Execute custom broadphase callback, if any
        bool do_narrow_contactgeneration = true;
        if (this->broad_callback)
            do_narrow_contactgeneration = this->broad_callback->OnBroadphase(icontact.modelA, icontact.modelB);

        if (do_narrow_contactgeneration) {
            int numContacts = contactManifold->getNumContacts();
            // GetLog() << "numContacts=" << numContacts << "\n";
            for (int j = 0; j < numContacts; j++) {
                cbtManifoldPoint& pt = contactManifold->getContactPoint(j);

                // Discard "too far" constraints (the Bullet engine also has its threshold)
                if (pt.getDistance() < marginA + marginB) {
                    cbtVector3 ptA = pt.getPositionWorldOnA();
                    cbtVector3 ptB = pt.getPositionWorldOnB();

                    icontact.vpA.Set(ptA.getX(), ptA.getY(), ptA.getZ());
                    icontact.vpB.Set(ptB.getX(), ptB.getY(), ptB.getZ());

                    icontact.vN.Set(-pt.m_normalWorldOnB.getX(), -pt.m_normalWorldOnB.getY(),
                                    -pt.m_normalWorldOnB.getZ());
                    icontact.vN.Normalize();

                    double ptdist = pt.getDistance();

                    icontact.vpA = icontact.vpA - icontact.vN * envelopeA;
                    icontact.vpB = icontact.vpB + icontact.vN * envelopeB;
                    icontact.distance = ptdist + envelopeA + envelopeB;

                    icontact.reaction_cache = pt.reactions_cache;

                    bool compoundA = (obA->getCollisionShape()->getShapeType() == COMPOUND_SHAPE_PROXYTYPE);
                    bool compoundB = (obB->getCollisionShape()->getShapeType() == COMPOUND_SHAPE_PROXYTYPE);

                    int indexA = compoundA ? pt.m_index0 : 0;
                    int indexB = compoundB ? pt.m_index1 : 0;

                    icontact.shapeA = icontact.modelA->GetShape(indexA).get();
                    icontact.shapeB = icontact.modelB->GetShape(indexB).get();

                    // Execute some user custom callback, if any
                    bool add_contact = true;
                    if (this->narrow_callback)
                        add_contact = this->narrow_callback->OnNarrowphase(icontact);

                    // Add to contact container
                    if (add_contact) {
                        ////std::cout << " add indexA=" << indexA << " indexB=" << indexB << std::endl;
                        ////std::cout << "     typeA=" << icontact.shapeA->m_type << " typeB=" << icontact.shapeB->m_type << std::endl;

                        mcontactcontainer->AddContact(icontact);
                    }
                }
            }
        }

        // Uncomment this line to remove all points
        ////contactManifold->clearManifold();
    }
    mcontactcontainer->EndAddContact();
}